

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
  _Var2;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
  _Var3;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  _Var4;
  char cVar5;
  int iVar6;
  unique_ptr<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  uVar7;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
  _Var8;
  
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                        .
                        super__Head_base<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                        ._M_head_impl.impl_._M_t + 0x18))();
  uVar7._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                 .super__Tuple_impl<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>.
                 super__Head_base<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                 ._M_head_impl.impl_._M_t;
  if ((_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
       )uVar7._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
        ._M_head_impl !=
      (ParamIteratorInterface<std::tuple<int,_int>_> *)
      *(tuple<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
        *)&(this->end_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
           .
           super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
           .super__Tuple_impl<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>.
           super__Head_base<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>.
           _M_head_impl.impl_._M_t) {
    cVar5 = (**(code **)(*(long *)uVar7._M_t.
                                  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                                  .
                                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                                  ._M_head_impl + 0x30))();
    if (cVar5 == '\0') goto LAB_006583fb;
  }
  uVar7._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>,_true,_true>
                  )(**(code **)(*(long *)(this->begin_).
                                         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                                         .
                                         super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                                         .
                                         super__Tuple_impl<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                                         .
                                         super__Head_base<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                                         ._M_head_impl.impl_._M_t + 0x20))();
  _Var1._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>.
  _M_head_impl = *(tuple<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                   *)&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Tuple_impl<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Head_base<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>
                      ._M_head_impl.impl_._M_t;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .super__Tuple_impl<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>.
  super__Head_base<2UL,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_false>._M_head_impl
  .impl_._M_t = uVar7._M_t.
                super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                .
                super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                ._M_head_impl;
  if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
        .
        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
       )0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_std::default_delete<testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
              + 0x18))();
  _Var2._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl !=
      ((ParamIteratorInterface<(anonymous_namespace)::TestVideoParam> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
      .
      super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
      )._M_head_impl) {
    iVar6 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar6 == '\0') goto LAB_006583fb;
  }
  _Var8.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
        )(**(code **)(*(long *)(this->begin_).
                               super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                               .
                               super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                               .
                               super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
                               ._M_head_impl.impl_._M_t.
                               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
                               .
                               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
                     + 0x20))();
  _Var3.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
  ;
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  .
  super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
       = _Var8.
         super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
         ._M_head_impl;
  if (_Var3.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<(anonymous_namespace)::TestVideoParam> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
                          ._M_head_impl + 8))();
  }
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                        ._M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
              + 0x18))();
  _Var4._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       ._M_head_impl;
  if (_Var4._M_head_impl !=
      ((ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      )._M_head_impl) {
    (*(_Var4._M_head_impl)->_vptr_ParamIteratorInterface[6])();
  }
LAB_006583fb:
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }